

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O1

void __thiscall
glslang::TBuiltInParseablesHlsl::initialize
          (TBuiltInParseablesHlsl *this,int param_1,EProfile param_2,SpvVersion *param_3)

{
  byte bVar1;
  byte bVar2;
  int arg;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  anon_struct_48_7_19417129 *paVar7;
  TString *pTVar8;
  byte *pbVar9;
  size_t sVar10;
  pool_allocator<char> *ppVar11;
  byte *pbVar12;
  byte *__s;
  size_t sVar13;
  uint uVar14;
  int arg_1;
  byte *pbVar15;
  uint uVar16;
  char *pcVar17;
  byte *nthArgOrder;
  byte bVar18;
  byte *pbVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  char *retType;
  char *retOrder;
  string name;
  uint local_144;
  pool_allocator<char> local_140;
  char *local_138;
  int local_12c;
  uint local_128;
  allocator<char> local_121;
  byte *local_120;
  anon_struct_48_7_19417129 *local_118;
  ulong local_110;
  byte *local_108;
  byte *local_100;
  uint local_f8;
  uint local_f4;
  int local_f0;
  undefined4 local_ec;
  long local_e8;
  TString *local_e0;
  TBuiltInParseablesHlsl *local_d8;
  TString *local_d0;
  TString *local_c8;
  byte *local_c0;
  byte *local_b8;
  pool_allocator<char> *local_b0;
  undefined1 local_a8 [40];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  local_c8 = &(this->super_TBuiltInParseables).commonBuiltins;
  local_d0 = (this->super_TBuiltInParseables).stageBuiltins;
  paVar7 = initialize::hlslIntrinsics;
  local_138 = "abort";
  pbVar15 = (byte *)0x0;
  local_e8 = 0;
  local_d8 = this;
LAB_0043328b:
  uVar16 = paVar7->stage;
  uVar5 = 0;
  local_118 = paVar7;
  local_f8 = uVar16;
  do {
    if ((uVar16 >> (uVar5 & 0x1f) & 1) != 0) {
      pTVar8 = local_d0 + uVar5;
      if (uVar16 == 0xd) {
        pTVar8 = local_c8;
      }
      __s = (byte *)paVar7->argOrder;
      local_f4 = uVar5;
      if (__s != (byte *)0x0) {
        while( true ) {
          local_e0 = pTVar8;
          if ((*__s == 0x2c) || (*__s == 0)) break;
          bVar1 = *__s;
          bVar20 = true;
          if (((bVar1 != 0x25) && (((bVar1 != 0x40 && ((bVar1 & 0xfd) != 0x24)) && (bVar1 != 0x2a)))
              ) && (bVar1 != 0x7e)) {
            bVar20 = (bVar1 & 0xfd) == 0x21;
          }
          uVar16 = 0x20000009 >> (bVar1 - 0x23 & 0x1f);
          local_ec = CONCAT31((int3)(uVar16 >> 8),(byte)uVar16 & (byte)(bVar1 - 0x23) < 0x1e);
          local_140.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     local_a8,local_138,&local_140);
          iVar3 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)local_a8,"Load");
          pbVar9 = __s;
          do {
            bVar18 = *pbVar9;
            uVar16 = 0;
            if ((bVar18 == 0) || (uVar16 = 0, bVar18 == 0x2c)) break;
            uVar16 = (int)(char)bVar18 - 0x30;
            pbVar9 = pbVar9 + 1;
          } while (9 < uVar16);
          local_140.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     local_a8,local_138,&local_140);
          local_128 = 0xffffffff;
          if ((bVar20) &&
             (iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_a8,"GetDimensions"), iVar4 != 0)) {
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_a8,"Load");
            local_128 = 2 - (iVar4 == 0);
          }
          uVar5 = 0;
          local_144 = 1;
          local_12c = 1;
          while( true ) {
            pbVar9 = __s;
            if (uVar5 != 0) {
              uVar14 = 0;
              do {
                for (; (bVar18 = *pbVar9, bVar18 != 0 && (bVar18 != 0x2c)); pbVar9 = pbVar9 + 1) {
                }
                if (bVar18 == 0) {
                  pbVar9 = pbVar15;
                }
                pbVar9 = pbVar9 + 1;
                if (bVar18 == 0) {
                  pbVar9 = pbVar15;
                }
                uVar14 = uVar14 + 1;
              } while ((uVar14 < uVar5) && (bVar18 != 0));
            }
            if (pbVar9 == (byte *)0x0) break;
            bVar18 = *pbVar9;
            if (bVar18 < 0x5b) {
              if (bVar18 == 0x4d) {
                local_144 = 4;
                local_12c = 4;
              }
              else if (bVar18 == 0x56) goto LAB_00433489;
            }
            else if ((bVar18 == 0x5d) || (bVar18 == 0x5b)) {
LAB_00433489:
              local_144 = 4;
            }
            uVar5 = uVar5 + 1;
          }
          if (uVar16 != 0) {
            local_144 = uVar16;
          }
          pbVar9 = (byte *)local_118->argType;
          iVar4 = uVar16 + (uVar16 == 0);
          if (pbVar9 != (byte *)0x0) {
            while ((local_f0 = iVar4, local_100 = pbVar9, *pbVar9 != 0x2c && (*pbVar9 != 0))) {
              local_140.allocator._0_4_ = local_f0;
              if (local_f0 <= (int)local_144) {
                do {
                  if (0 < local_12c) {
                    local_b8 = (byte *)local_118->retOrder;
                    if ((byte *)local_118->retOrder == (byte *)0x0) {
                      local_b8 = __s;
                    }
                    local_c0 = (byte *)local_118->retType;
                    if ((byte *)local_118->retType == (byte *)0x0) {
                      local_c0 = local_100;
                    }
                    local_110 = 1;
                    do {
                      bVar18 = *__s;
                      uVar16 = (uint)local_140.allocator;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_a8,local_138,&local_121);
                      if ((uVar16 == 1) &&
                         (((iVar4 = std::__cxx11::string::compare((char *)local_a8), iVar4 == 0 ||
                           (iVar4 = std::__cxx11::string::compare((char *)local_a8), iVar4 == 0)) ||
                          (iVar4 = std::__cxx11::string::compare((char *)local_a8), iVar4 == 0)))) {
                        bVar21 = false;
                      }
                      else {
                        bVar21 = false;
                        if ((bVar18 != 0x25) && (bVar21 = false, bVar18 != 0x40)) {
                          bVar21 = false;
                          if (((bVar18 & 0xfd) != 0x24) && ((bVar18 != 0x2a && (bVar18 != 0x7e)))) {
                            bVar21 = (bVar18 & 0xfd) != 0x21;
                          }
                        }
                        bVar21 = (bool)(bVar21 ^ 1U | bVar18 != 0x56 | uVar16 != 1);
                      }
                      if ((TPoolAllocator *)local_a8._0_8_ != (TPoolAllocator *)(local_a8 + 0x10)) {
                        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
                      }
                      if (bVar21) {
                        if (bVar20) {
                          local_a8._0_8_ = GetThreadPoolAllocator();
                          std::__cxx11::
                          basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                          basic_string<glslang::std::allocator<char>>
                                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                      *)&local_80,local_138,(pool_allocator<char> *)local_a8);
                          bVar2 = *__s;
                          local_120 = (byte *)CONCAT71(local_120._1_7_,bVar2 == 0x2a);
                          local_108 = (byte *)CONCAT71(local_108._1_7_,bVar2 == 0x7e);
                          if (uVar16 == 3) {
                            bVar18 = 1;
                            if (((byte)(bVar2 - 0x23) < 0x1e &
                                (byte)(0x20000009 >> (bVar2 - 0x23 & 0x1f))) == 0) {
                              iVar4 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(&local_80,"SampleCmp");
                              if (iVar4 == 0) goto LAB_00433914;
                              iVar4 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(&local_80,"SampleCmpLevelZero");
                              if (iVar4 != 0) goto LAB_004336b0;
                            }
                          }
                          else {
LAB_004336b0:
                            sVar10 = strlen((char *)__s);
                            if (sVar10 == 0) {
                              iVar4 = 0;
                            }
                            else {
                              sVar13 = 0;
                              iVar4 = 0;
                              do {
                                iVar4 = iVar4 + (uint)(__s[sVar13] == 0x2c);
                                sVar13 = sVar13 + 1;
                              } while (sVar10 != sVar13);
                            }
                            if (uVar16 == 4) {
                              iVar6 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(&local_80,"Sample");
                              bVar18 = 1;
                              if ((((((iVar4 < 3) || (iVar6 != 0)) &&
                                    ((iVar6 = std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::compare(&local_80,"SampleBias"), iVar4 < 4 ||
                                     (iVar6 != 0)))) &&
                                   ((iVar6 = std::__cxx11::
                                             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                             ::compare(&local_80,"SampleCmp"), iVar4 < 4 ||
                                    (iVar6 != 0)))) &&
                                  ((iVar6 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::compare(&local_80,"SampleCmpLevelZero"), iVar4 < 4 ||
                                   (iVar6 != 0)))) &&
                                 ((iVar6 = std::__cxx11::
                                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                           ::compare(&local_80,"SampleGrad"), iVar4 < 5 ||
                                  (iVar6 != 0)))) {
                                iVar6 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(&local_80,"SampleLevel");
                                if ((3 < iVar4) && (iVar6 == 0)) goto LAB_00433919;
                                goto LAB_004337a5;
                              }
LAB_00433914:
                              bVar18 = 1;
                            }
                            else {
LAB_004337a5:
                              iVar6 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(&local_80,"Gather");
                              bVar21 = true;
                              if (iVar6 != 0) {
                                iVar6 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(&local_80,"GatherRed");
                                bVar21 = true;
                                if (iVar6 != 0) {
                                  iVar6 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::compare(&local_80,"GatherGreen");
                                  bVar21 = true;
                                  if (iVar6 != 0) {
                                    iVar6 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::compare(&local_80,"GatherBlue");
                                    bVar21 = true;
                                    if (iVar6 != 0) {
                                      iVar6 = std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::compare(&local_80,"GatherAlpha");
                                      bVar21 = iVar6 == 0;
                                    }
                                  }
                                }
                              }
                              iVar6 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(&local_80,"GatherCmp");
                              if (((iVar6 == 0) ||
                                  (iVar6 = std::__cxx11::
                                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                           ::compare(&local_80,"GatherCmpRed"), iVar6 == 0)) ||
                                 (iVar6 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::compare(&local_80,"GatherCmpGreen"), iVar6 == 0)) {
                                bVar22 = true;
                              }
                              else {
                                iVar6 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(&local_80,"GatherCmpBlue");
                                bVar22 = true;
                                if (iVar6 != 0) {
                                  iVar6 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::compare(&local_80,"GatherCmpAlpha");
                                  bVar22 = iVar6 == 0;
                                }
                              }
                              if ((!(bool)(bVar21 | bVar22)) ||
                                 ((bVar18 = 1, (uVar16 | 2) != 3 &&
                                  ((uVar16 != 4 ||
                                   (!(bool)(3 < iVar4 & bVar22 | 2 < iVar4 & bVar21))))))) {
                                iVar4 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(&local_80,"Load");
                                bVar18 = 1;
                                if (uVar16 != 2 && (bVar2 & 0xfd) == 0x24) goto LAB_00433914;
                                if (iVar4 != 0 || uVar16 != 4) {
                                  bVar18 = uVar16 != 1 & ((byte)local_120 | (byte)local_108);
                                }
                              }
                            }
                          }
                        }
                        else {
                          bVar18 = 0;
                        }
LAB_00433919:
                        pTVar8 = local_e0;
                        if (bVar18 == 0) {
                          iVar4 = (uint)local_140.allocator;
                          anon_unknown.dwarf_125bedc::AppendTypeName
                                    (local_e0,(char *)local_b8,(char *)local_c0,
                                     (uint)local_140.allocator,(int)local_110);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::append(pTVar8," ");
                          if (local_118->method == true) {
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::append(pTVar8,"__BI_");
                          }
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::append(pTVar8,local_138);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::append(pTVar8,"(");
                          local_b0 = &local_140;
                          if (3 < iVar4) {
                            local_b0 = (pool_allocator<char> *)local_a8;
                          }
                          local_120 = (byte *)0x0;
                          local_108 = (byte *)0x0;
                          uVar16 = 0;
                          while( true ) {
                            pbVar9 = __s;
                            if (uVar16 != 0) {
                              uVar5 = 0;
                              do {
                                for (; (bVar18 = *pbVar9, bVar18 != 0 && (bVar18 != 0x2c));
                                    pbVar9 = pbVar9 + 1) {
                                }
                                if (bVar18 == 0) {
                                  pbVar9 = pbVar15;
                                }
                                pbVar9 = pbVar9 + 1;
                                if (bVar18 == 0) {
                                  pbVar9 = pbVar15;
                                }
                                uVar5 = uVar5 + 1;
                              } while ((uVar5 < uVar16) && (bVar18 != 0));
                            }
                            pbVar19 = local_100;
                            if (uVar16 != 0) {
                              uVar5 = 0;
                              do {
                                for (; (bVar18 = *pbVar19, bVar18 != 0 && (bVar18 != 0x2c));
                                    pbVar19 = pbVar19 + 1) {
                                }
                                if (bVar18 == 0) {
                                  pbVar19 = pbVar15;
                                }
                                pbVar19 = pbVar19 + 1;
                                if (bVar18 == 0) {
                                  pbVar19 = pbVar15;
                                }
                                uVar5 = uVar5 + 1;
                              } while ((uVar5 < uVar16) && (bVar18 != 0));
                            }
                            if ((pbVar9 == (byte *)0x0) || (pbVar19 == (byte *)0x0)) break;
                            ppVar11 = &local_140;
                            if (bVar20 && uVar16 != 0) {
                              local_a8._0_4_ = 3;
                              ppVar11 = local_b0;
                            }
                            iVar4 = *(int *)&ppVar11->allocator;
                            pcVar17 = "";
                            if (uVar16 != 0) {
                              pcVar17 = ", ";
                            }
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::append(pTVar8,pcVar17);
                            pbVar12 = (byte *)anon_unknown.dwarf_125bedc::IoParam
                                                        (pTVar8,(char *)pbVar9);
                            nthArgOrder = local_120;
                            if ((*pbVar12 != 0) && (*pbVar12 != 0x2c)) {
                              nthArgOrder = pbVar12;
                              local_120 = pbVar9;
                            }
                            if ((*pbVar19 != 0) && (*pbVar19 != 0x2c)) {
                              local_108 = pbVar19;
                            }
                            pcVar17 = anon_unknown.dwarf_125bedc::IoParam
                                                (pTVar8,(char *)nthArgOrder);
                            uVar5 = 0;
                            if ((uVar16 == local_128 & (byte)local_ec) == 1) {
                              local_a8._0_8_ = GetThreadPoolAllocator();
                              std::__cxx11::
                              basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                              ::basic_string<glslang::std::allocator<char>>
                                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                          *)&local_58,local_138,(pool_allocator<char> *)local_a8);
                              iVar6 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(&local_58,"CalculateLevelOfDetail");
                              if (iVar6 != 0) {
                                iVar6 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(&local_58,"CalculateLevelOfDetailUnclamped");
                                uVar5 = (uint)(iVar6 != 0);
                              }
                            }
                            pTVar8 = local_e0;
                            iVar4 = iVar4 + (uVar16 == local_128 &&
                                            (((bVar1 != 0x7e && bVar1 != 0x2a) &&
                                             (bVar1 & 0xfd) != 0x21) &&
                                            (iVar3 == 0 && (bVar1 & 0xfd) != 0x24))) + uVar5;
                            if (((uVar16 != 0) && ((bool)(iVar4 == 1 & bVar20))) &&
                               (*pcVar17 == 'V')) {
                              pcVar17 = "S";
                            }
                            anon_unknown.dwarf_125bedc::AppendTypeName
                                      (local_e0,pcVar17,(char *)local_108,iVar4,(int)local_110);
                            uVar16 = uVar16 + 1;
                          }
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::append(pTVar8,");\n");
                        }
                      }
                      iVar4 = (int)local_110;
                      local_110 = (ulong)(iVar4 + 1);
                    } while (iVar4 != local_12c);
                  }
                  iVar4 = (uint)local_140.allocator;
                  local_140.allocator._0_4_ = (uint)local_140.allocator + 1;
                } while (iVar4 < (int)local_144);
              }
              iVar4 = local_f0;
              pbVar9 = local_100 + 1;
            }
          }
          if (bVar20) {
            iVar3 = isalpha((int)(char)__s[1]);
            if (iVar3 != 0) {
              __s = __s + 1;
            }
          }
          pbVar9 = __s + 1;
          if (9 < (int)(char)__s[1] - 0x30U) {
            pbVar9 = __s;
          }
          __s = pbVar9 + 1;
          pTVar8 = local_e0;
        }
      }
      paVar7 = local_118;
      uVar16 = local_f8;
      uVar5 = local_f4;
      if (local_f8 == 0xd) break;
    }
    if (0xc < uVar5) break;
    uVar5 = uVar5 + 1;
  } while( true );
  local_e8 = local_e8 + 1;
  paVar7 = initialize::hlslIntrinsics + local_e8;
  local_138 = initialize::hlslIntrinsics[local_e8].name;
  if (local_138 == (char *)0x0) {
    createMatTimesMat(local_d8);
    return;
  }
  goto LAB_0043328b;
}

Assistant:

void TBuiltInParseablesHlsl::initialize(int /*version*/, EProfile /*profile*/, const SpvVersion& /*spvVersion*/)
{
    static const EShLanguageMask EShLangAll    = EShLanguageMask(EShLangCount - 1);

    // These are the actual stage masks defined in the documentation, in case they are
    // needed for future validation.  For now, they are commented out, and set below
    // to EShLangAll, to allow any intrinsic to be used in any shader, which is legal
    // if it is not called.
    //
    // static const EShLanguageMask EShLangPSCS   = EShLanguageMask(EShLangFragmentMask | EShLangComputeMask);
    // static const EShLanguageMask EShLangVSPSGS = EShLanguageMask(EShLangVertexMask | EShLangFragmentMask | EShLangGeometryMask);
    // static const EShLanguageMask EShLangCS     = EShLangComputeMask;
    // static const EShLanguageMask EShLangPS     = EShLangFragmentMask;
    // static const EShLanguageMask EShLangHS     = EShLangTessControlMask;

    // This set uses EShLangAll for everything.
    static const EShLanguageMask EShLangPSCS   = EShLangAll;
    static const EShLanguageMask EShLangVSPSGS = EShLangAll;
    static const EShLanguageMask EShLangCS     = EShLangAll;
    static const EShLanguageMask EShLangPS     = EShLangAll;
    static const EShLanguageMask EShLangHS     = EShLangAll;
    static const EShLanguageMask EShLangGS     = EShLangAll;

    // This structure encodes the prototype information for each HLSL intrinsic.
    // Because explicit enumeration would be cumbersome, it's procedurally generated.
    // orderKey can be:
    //   S = scalar, V = vector, M = matrix, - = void
    // typekey can be:
    //   D = double, F = float, U = uint, I = int, B = bool, S = sampler, s = shadowSampler, M = uint64_t, L = int64_t
    // An empty order or type key repeats the first one.  E.g: SVM,, means 3 args each of SVM.
    // '>' as first letter of order creates an output parameter
    // '<' as first letter of order creates an input parameter
    // '^' as first letter of order takes transpose dimensions
    // '%' as first letter of order creates texture of given F/I/U type (texture, itexture, etc)
    // '@' as first letter of order creates arrayed texture of given type
    // '$' / '&' as first letter of order creates 2DMS / 2DMSArray textures
    // '*' as first letter of order creates buffer object
    // '!' as first letter of order creates image object
    // '#' as first letter of order creates arrayed image object
    // '~' as first letter of order creates an image buffer object
    // '[' / ']' as first letter of order creates a SubpassInput/SubpassInputMS object

    static const struct {
        const char*   name;      // intrinsic name
        const char*   retOrder;  // return type key: empty matches order of 1st argument
        const char*   retType;   // return type key: empty matches type of 1st argument
        const char*   argOrder;  // argument order key
        const char*   argType;   // argument type key
        unsigned int  stage;     // stage mask
        bool          method;    // true if it's a method.
    } hlslIntrinsics[] = {
        // name                               retOrd   retType    argOrder          argType          stage mask     method
        // ----------------------------------------------------------------------------------------------------------------
        { "abort",                            nullptr, nullptr,   "-",              "-",             EShLangAll,    false },
        { "abs",                              nullptr, nullptr,   "SVM",            "DFUI",          EShLangAll,    false },
        { "acos",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "all",                              "S",    "B",        "SVM",            "BFIU",          EShLangAll,    false },
        { "AllMemoryBarrier",                 nullptr, nullptr,   "-",              "-",             EShLangCS,     false },
        { "AllMemoryBarrierWithGroupSync",    nullptr, nullptr,   "-",              "-",             EShLangCS,     false },
        { "any",                              "S",     "B",       "SVM",            "BFIU",          EShLangAll,    false },
        { "asdouble",                         "S",     "D",       "S,",             "UI,",           EShLangAll,    false },
        { "asdouble",                         "V2",    "D",       "V2,",            "UI,",           EShLangAll,    false },
        { "asfloat",                          nullptr, "F",       "SVM",            "BFIU",          EShLangAll,    false },
        { "asin",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "asint",                            nullptr, "I",       "SVM",            "FIU",           EShLangAll,    false },
        { "asuint",                           nullptr, "U",       "SVM",            "FIU",           EShLangAll,    false },
        { "atan",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "atan2",                            nullptr, nullptr,   "SVM,",           "F,",            EShLangAll,    false },
        { "ceil",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "CheckAccessFullyMapped",           "S",     "B" ,      "S",              "U",             EShLangPSCS,   false },
        { "clamp",                            nullptr, nullptr,   "SVM,,",          "FUI,,",         EShLangAll,    false },
        { "clip",                             "-",     "-",       "SVM",            "FUI",           EShLangPS,     false },
        { "cos",                              nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "cosh",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "countbits",                        nullptr, nullptr,   "SV",             "UI",            EShLangAll,    false },
        { "cross",                            nullptr, nullptr,   "V3,",            "F,",            EShLangAll,    false },
        { "D3DCOLORtoUBYTE4",                 "V4",    "I",       "V4",             "F",             EShLangAll,    false },
        { "ddx",                              nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "ddx_coarse",                       nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "ddx_fine",                         nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "ddy",                              nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "ddy_coarse",                       nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "ddy_fine",                         nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "degrees",                          nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "determinant",                      "S",     "F",       "M",              "F",             EShLangAll,    false },
        { "DeviceMemoryBarrier",              nullptr, nullptr,   "-",              "-",             EShLangPSCS,   false },
        { "DeviceMemoryBarrierWithGroupSync", nullptr, nullptr,   "-",              "-",             EShLangCS,     false },
        { "distance",                         "S",     "F",       "SV,",            "F,",            EShLangAll,    false },
        { "dot",                              "S",     nullptr,   "SV,",            "FI,",           EShLangAll,    false },
        { "dst",                              nullptr, nullptr,   "V4,",            "F,",            EShLangAll,    false },
        // { "errorf",                           "-",     "-",       "",             "",             EShLangAll,    false }, TODO: varargs
        { "EvaluateAttributeAtCentroid",      nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "EvaluateAttributeAtSample",        nullptr, nullptr,   "SVM,S",          "F,U",           EShLangPS,     false },
        { "EvaluateAttributeSnapped",         nullptr, nullptr,   "SVM,V2",         "F,I",           EShLangPS,     false },
        { "exp",                              nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "exp2",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "f16tof32",                         nullptr, "F",       "SV",             "U",             EShLangAll,    false },
        { "f32tof16",                         nullptr, "U",       "SV",             "F",             EShLangAll,    false },
        { "faceforward",                      nullptr, nullptr,   "V,,",            "F,,",           EShLangAll,    false },
        { "firstbithigh",                     nullptr, nullptr,   "SV",             "UI",            EShLangAll,    false },
        { "firstbitlow",                      nullptr, nullptr,   "SV",             "UI",            EShLangAll,    false },
        { "floor",                            nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "fma",                              nullptr, nullptr,   "SVM,,",          "D,,",           EShLangAll,    false },
        { "fmod",                             nullptr, nullptr,   "SVM,",           "F,",            EShLangAll,    false },
        { "frac",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "frexp",                            nullptr, nullptr,   "SVM,",           "F,",            EShLangAll,    false },
        { "fwidth",                           nullptr, nullptr,   "SVM",            "F",             EShLangPS,     false },
        { "GetRenderTargetSampleCount",       "S",     "U",       "-",              "-",             EShLangAll,    false },
        { "GetRenderTargetSamplePosition",    "V2",    "F",       "V1",             "I",             EShLangAll,    false },
        { "GroupMemoryBarrier",               nullptr, nullptr,   "-",              "-",             EShLangCS,     false },
        { "GroupMemoryBarrierWithGroupSync",  nullptr, nullptr,   "-",              "-",             EShLangCS,     false },
        { "InterlockedAdd",                   "-",     "-",       "SVM,,>",         "FUI,,",          EShLangPSCS,   false },
        { "InterlockedAdd",                   "-",     "-",       "SVM,",           "FUI,",           EShLangPSCS,   false },
        { "InterlockedAnd",                   "-",     "-",       "SVM,,>",         "UI,,",          EShLangPSCS,   false },
        { "InterlockedAnd",                   "-",     "-",       "SVM,",           "UI,",           EShLangPSCS,   false },
        { "InterlockedCompareExchange",       "-",     "-",       "SVM,,,>",        "UI,,,",         EShLangPSCS,   false },
        { "InterlockedCompareStore",          "-",     "-",       "SVM,,",          "UI,,",          EShLangPSCS,   false },
        { "InterlockedExchange",              "-",     "-",       "SVM,,>",         "UI,,",          EShLangPSCS,   false },
        { "InterlockedMax",                   "-",     "-",       "SVM,,>",         "UI,,",          EShLangPSCS,   false },
        { "InterlockedMax",                   "-",     "-",       "SVM,",           "UI,",           EShLangPSCS,   false },
        { "InterlockedMin",                   "-",     "-",       "SVM,,>",         "UI,,",          EShLangPSCS,   false },
        { "InterlockedMin",                   "-",     "-",       "SVM,",           "UI,",           EShLangPSCS,   false },
        { "InterlockedOr",                    "-",     "-",       "SVM,,>",         "UI,,",          EShLangPSCS,   false },
        { "InterlockedOr",                    "-",     "-",       "SVM,",           "UI,",           EShLangPSCS,   false },
        { "InterlockedXor",                   "-",     "-",       "SVM,,>",         "UI,,",          EShLangPSCS,   false },
        { "InterlockedXor",                   "-",     "-",       "SVM,",           "UI,",           EShLangPSCS,   false },
        { "isfinite",                         nullptr, "B" ,      "SVM",            "F",             EShLangAll,    false },
        { "isinf",                            nullptr, "B" ,      "SVM",            "F",             EShLangAll,    false },
        { "isnan",                            nullptr, "B" ,      "SVM",            "F",             EShLangAll,    false },
        { "ldexp",                            nullptr, nullptr,   "SVM,",           "F,",            EShLangAll,    false },
        { "length",                           "S",     "F",       "SV",             "F",             EShLangAll,    false },
        { "lerp",                             nullptr, nullptr,   "VM,,",           "F,,",           EShLangAll,    false },
        { "lerp",                             nullptr, nullptr,   "SVM,,S",         "F,,",           EShLangAll,    false },
        { "lit",                              "V4",    "F",       "S,,",            "F,,",           EShLangAll,    false },
        { "log",                              nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "log10",                            nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "log2",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "mad",                              nullptr, nullptr,   "SVM,,",          "DFUI,,",        EShLangAll,    false },
        { "max",                              nullptr, nullptr,   "SVM,",           "FIU,",          EShLangAll,    false },
        { "min",                              nullptr, nullptr,   "SVM,",           "FIU,",          EShLangAll,    false },
        { "modf",                             nullptr, nullptr,   "SVM,>",          "FIU,",          EShLangAll,    false },
        { "msad4",                            "V4",    "U",       "S,V2,V4",        "U,,",           EShLangAll,    false },
        { "mul",                              "S",     nullptr,   "S,S",            "FI,",           EShLangAll,    false },
        { "mul",                              "V",     nullptr,   "S,V",            "FI,",           EShLangAll,    false },
        { "mul",                              "M",     nullptr,   "S,M",            "FI,",           EShLangAll,    false },
        { "mul",                              "V",     nullptr,   "V,S",            "FI,",           EShLangAll,    false },
        { "mul",                              "S",     nullptr,   "V,V",            "FI,",           EShLangAll,    false },
        { "mul",                              "M",     nullptr,   "M,S",            "FI,",           EShLangAll,    false },
        // mat*mat form of mul is handled in createMatTimesMat()
        { "noise",                            "S",     "F",       "V",              "F",             EShLangPS,     false },
        { "normalize",                        nullptr, nullptr,   "V",              "F",             EShLangAll,    false },
        { "pow",                              nullptr, nullptr,   "SVM,",           "F,",            EShLangAll,    false },
        { "printf",                           nullptr, nullptr,   "-",              "-",             EShLangAll,    false },
        { "Process2DQuadTessFactorsAvg",      "-",     "-",       "V4,V2,>V4,>V2,", "F,,,,",         EShLangHS,     false },
        { "Process2DQuadTessFactorsMax",      "-",     "-",       "V4,V2,>V4,>V2,", "F,,,,",         EShLangHS,     false },
        { "Process2DQuadTessFactorsMin",      "-",     "-",       "V4,V2,>V4,>V2,", "F,,,,",         EShLangHS,     false },
        { "ProcessIsolineTessFactors",        "-",     "-",       "S,,>,>",         "F,,,",          EShLangHS,     false },
        { "ProcessQuadTessFactorsAvg",        "-",     "-",       "V4,S,>V4,>V2,",  "F,,,,",         EShLangHS,     false },
        { "ProcessQuadTessFactorsMax",        "-",     "-",       "V4,S,>V4,>V2,",  "F,,,,",         EShLangHS,     false },
        { "ProcessQuadTessFactorsMin",        "-",     "-",       "V4,S,>V4,>V2,",  "F,,,,",         EShLangHS,     false },
        { "ProcessTriTessFactorsAvg",         "-",     "-",       "V3,S,>V3,>S,",   "F,,,,",         EShLangHS,     false },
        { "ProcessTriTessFactorsMax",         "-",     "-",       "V3,S,>V3,>S,",   "F,,,,",         EShLangHS,     false },
        { "ProcessTriTessFactorsMin",         "-",     "-",       "V3,S,>V3,>S,",   "F,,,,",         EShLangHS,     false },
        { "radians",                          nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "rcp",                              nullptr, nullptr,   "SVM",            "FD",            EShLangAll,    false },
        { "reflect",                          nullptr, nullptr,   "V,",             "F,",            EShLangAll,    false },
        { "refract",                          nullptr, nullptr,   "V,V,S",          "F,,",           EShLangAll,    false },
        { "reversebits",                      nullptr, nullptr,   "SV",             "UI",            EShLangAll,    false },
        { "round",                            nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "rsqrt",                            nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "saturate",                         nullptr, nullptr ,  "SVM",            "F",             EShLangAll,    false },
        { "sign",                             nullptr, nullptr,   "SVM",            "FI",            EShLangAll,    false },
        { "sin",                              nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "sincos",                           "-",     "-",       "SVM,>,>",        "F,,",           EShLangAll,    false },
        { "sinh",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "smoothstep",                       nullptr, nullptr,   "SVM,,",          "F,,",           EShLangAll,    false },
        { "sqrt",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "step",                             nullptr, nullptr,   "SVM,",           "F,",            EShLangAll,    false },
        { "tan",                              nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "tanh",                             nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },
        { "tex1D",                            "V4",    "F",       "S,S",            "S,F",           EShLangPS,     false },
        { "tex1D",                            "V4",    "F",       "S,S,V1,",        "S,F,,",         EShLangPS,     false },
        { "tex1Dbias",                        "V4",    "F",       "S,V4",           "S,F",           EShLangPS,     false },
        { "tex1Dgrad",                        "V4",    "F",       "S,,,",           "S,F,,",         EShLangPS,     false },
        { "tex1Dlod",                         "V4",    "F",       "S,V4",           "S,F",           EShLangPS,     false },
        { "tex1Dproj",                        "V4",    "F",       "S,V4",           "S,F",           EShLangPS,     false },
        { "tex2D",                            "V4",    "F",       "V2,",            "S,F",           EShLangPS,     false },
        { "tex2D",                            "V4",    "F",       "V2,,,",          "S,F,,",         EShLangPS,     false },
        { "tex2Dbias",                        "V4",    "F",       "V2,V4",          "S,F",           EShLangPS,     false },
        { "tex2Dgrad",                        "V4",    "F",       "V2,,,",          "S,F,,",         EShLangPS,     false },
        { "tex2Dlod",                         "V4",    "F",       "V2,V4",          "S,F",           EShLangAll,    false },
        { "tex2Dproj",                        "V4",    "F",       "V2,V4",          "S,F",           EShLangPS,     false },
        { "tex3D",                            "V4",    "F",       "V3,",            "S,F",           EShLangPS,     false },
        { "tex3D",                            "V4",    "F",       "V3,,,",          "S,F,,",         EShLangPS,     false },
        { "tex3Dbias",                        "V4",    "F",       "V3,V4",          "S,F",           EShLangPS,     false },
        { "tex3Dgrad",                        "V4",    "F",       "V3,,,",          "S,F,,",         EShLangPS,     false },
        { "tex3Dlod",                         "V4",    "F",       "V3,V4",          "S,F",           EShLangPS,     false },
        { "tex3Dproj",                        "V4",    "F",       "V3,V4",          "S,F",           EShLangPS,     false },
        { "texCUBE",                          "V4",    "F",       "V4,V3",          "S,F",           EShLangPS,     false },
        { "texCUBE",                          "V4",    "F",       "V4,V3,,",        "S,F,,",         EShLangPS,     false },
        { "texCUBEbias",                      "V4",    "F",       "V4,",            "S,F",           EShLangPS,     false },
        { "texCUBEgrad",                      "V4",    "F",       "V4,V3,,",        "S,F,,",         EShLangPS,     false },
        { "texCUBElod",                       "V4",    "F",       "V4,",            "S,F",           EShLangPS,     false },
        { "texCUBEproj",                      "V4",    "F",       "V4,",            "S,F",           EShLangPS,     false },
        { "transpose",                        "^M",    nullptr,   "M",              "FUIB",          EShLangAll,    false },
        { "trunc",                            nullptr, nullptr,   "SVM",            "F",             EShLangAll,    false },

        // Texture object methods.  Return type can be overridden by shader declaration.
        // !O = no offset, O = offset
        { "Sample",             /*!O*/        "V4",    nullptr,   "%@,S,V",         "FIU,S,F",        EShLangPS,    true },
        { "Sample",             /* O*/        "V4",    nullptr,   "%@,S,V,",        "FIU,S,F,I",      EShLangPS,    true },

        { "SampleBias",         /*!O*/        "V4",    nullptr,   "%@,S,V,S",       "FIU,S,F,F",      EShLangPS,    true },
        { "SampleBias",         /* O*/        "V4",    nullptr,   "%@,S,V,S,V",     "FIU,S,F,F,I",    EShLangPS,    true },

        // TODO: FXC accepts int/uint samplers here.  unclear what that means.
        { "SampleCmp",          /*!O*/        "S",     "F",       "%@,S,V,S",       "FIU,s,F,",       EShLangPS,    true },
        { "SampleCmp",          /* O*/        "S",     "F",       "%@,S,V,S,V",     "FIU,s,F,,I",     EShLangPS,    true },

        // TODO: FXC accepts int/uint samplers here.  unclear what that means.
        { "SampleCmpLevelZero", /*!O*/        "S",     "F",       "%@,S,V,S",       "FIU,s,F,F",      EShLangPS,    true },
        { "SampleCmpLevelZero", /* O*/        "S",     "F",       "%@,S,V,S,V",     "FIU,s,F,F,I",    EShLangPS,    true },

        { "SampleGrad",         /*!O*/        "V4",    nullptr,   "%@,S,V,,",       "FIU,S,F,,",      EShLangAll,   true },
        { "SampleGrad",         /* O*/        "V4",    nullptr,   "%@,S,V,,,",      "FIU,S,F,,,I",    EShLangAll,   true },

        { "SampleLevel",        /*!O*/        "V4",    nullptr,   "%@,S,V,S",       "FIU,S,F,",       EShLangAll,   true },
        { "SampleLevel",        /* O*/        "V4",    nullptr,   "%@,S,V,S,V",     "FIU,S,F,,I",     EShLangAll,   true },

        { "Load",               /*!O*/        "V4",    nullptr,   "%@,V",           "FIU,I",          EShLangAll,   true },
        { "Load",               /* O*/        "V4",    nullptr,   "%@,V,V",         "FIU,I,I",        EShLangAll,   true },
        { "Load", /* +sampleidex*/            "V4",    nullptr,   "$&,V,S",         "FIU,I,I",        EShLangAll,   true },
        { "Load", /* +samplindex, offset*/    "V4",    nullptr,   "$&,V,S,V",       "FIU,I,I,I",      EShLangAll,   true },

        // RWTexture loads
        { "Load",                             "V4",    nullptr,   "!#,V",           "FIU,I",          EShLangAll,   true },
        // (RW)Buffer loads
        { "Load",                             "V4",    nullptr,   "~*1,V",          "FIU,I",          EShLangAll,   true },

        { "Gather",             /*!O*/        "V4",    nullptr,   "%@,S,V",         "FIU,S,F",        EShLangAll,   true },
        { "Gather",             /* O*/        "V4",    nullptr,   "%@,S,V,V",       "FIU,S,F,I",      EShLangAll,   true },

        { "CalculateLevelOfDetail",           "S",     "F",       "%@,S,V",         "FUI,S,F",        EShLangPS,    true },
        { "CalculateLevelOfDetailUnclamped",  "S",     "F",       "%@,S,V",         "FUI,S,F",        EShLangPS,    true },

        { "GetSamplePosition",                "V2",    "F",       "$&2,S",          "FUI,I",          EShLangVSPSGS,true },

        //
        // UINT Width
        // UINT MipLevel, UINT Width, UINT NumberOfLevels
        { "GetDimensions",   /* 1D */         "-",     "-",       "%!~1,>S",        "FUI,U",          EShLangAll,   true },
        { "GetDimensions",   /* 1D */         "-",     "-",       "%!~1,>S",        "FUI,F",          EShLangAll,   true },
        { "GetDimensions",   /* 1D */         "-",     "-",       "%1,S,>S,",       "FUI,U,,",        EShLangAll,   true },
        { "GetDimensions",   /* 1D */         "-",     "-",       "%1,S,>S,",       "FUI,U,F,",       EShLangAll,   true },

        // UINT Width, UINT Elements
        // UINT MipLevel, UINT Width, UINT Elements, UINT NumberOfLevels
        { "GetDimensions",   /* 1DArray */    "-",     "-",       "@#1,>S,",        "FUI,U,",         EShLangAll,   true },
        { "GetDimensions",   /* 1DArray */    "-",     "-",       "@#1,>S,",        "FUI,F,",         EShLangAll,   true },
        { "GetDimensions",   /* 1DArray */    "-",     "-",       "@1,S,>S,,",      "FUI,U,,,",       EShLangAll,   true },
        { "GetDimensions",   /* 1DArray */    "-",     "-",       "@1,S,>S,,",      "FUI,U,F,,",      EShLangAll,   true },

        // UINT Width, UINT Height
        // UINT MipLevel, UINT Width, UINT Height, UINT NumberOfLevels
        { "GetDimensions",   /* 2D */         "-",     "-",       "%!2,>S,",        "FUI,U,",         EShLangAll,   true },
        { "GetDimensions",   /* 2D */         "-",     "-",       "%!2,>S,",        "FUI,F,",         EShLangAll,   true },
        { "GetDimensions",   /* 2D */         "-",     "-",       "%2,S,>S,,",      "FUI,U,,,",       EShLangAll,   true },
        { "GetDimensions",   /* 2D */         "-",     "-",       "%2,S,>S,,",      "FUI,U,F,,",      EShLangAll,   true },

        // UINT Width, UINT Height, UINT Elements
        // UINT MipLevel, UINT Width, UINT Height, UINT Elements, UINT NumberOfLevels
        { "GetDimensions",   /* 2DArray */    "-",     "-",       "@#2,>S,,",       "FUI,U,,",        EShLangAll,   true },
        { "GetDimensions",   /* 2DArray */    "-",     "-",       "@#2,>S,,",       "FUI,F,F,F",      EShLangAll,   true },
        { "GetDimensions",   /* 2DArray */    "-",     "-",       "@2,S,>S,,,",     "FUI,U,,,,",      EShLangAll,   true },
        { "GetDimensions",   /* 2DArray */    "-",     "-",       "@2,S,>S,,,",     "FUI,U,F,,,",     EShLangAll,   true },

        // UINT Width, UINT Height, UINT Depth
        // UINT MipLevel, UINT Width, UINT Height, UINT Depth, UINT NumberOfLevels
        { "GetDimensions",   /* 3D */         "-",     "-",       "%!3,>S,,",       "FUI,U,,",        EShLangAll,   true },
        { "GetDimensions",   /* 3D */         "-",     "-",       "%!3,>S,,",       "FUI,F,,",        EShLangAll,   true },
        { "GetDimensions",   /* 3D */         "-",     "-",       "%3,S,>S,,,",     "FUI,U,,,,",      EShLangAll,   true },
        { "GetDimensions",   /* 3D */         "-",     "-",       "%3,S,>S,,,",     "FUI,U,F,,,",     EShLangAll,   true },

        // UINT Width, UINT Height
        // UINT MipLevel, UINT Width, UINT Height, UINT NumberOfLevels
        { "GetDimensions",   /* Cube */       "-",     "-",       "%4,>S,",         "FUI,U,",         EShLangAll,   true },
        { "GetDimensions",   /* Cube */       "-",     "-",       "%4,>S,",         "FUI,F,",         EShLangAll,   true },
        { "GetDimensions",   /* Cube */       "-",     "-",       "%4,S,>S,,",      "FUI,U,,,",       EShLangAll,   true },
        { "GetDimensions",   /* Cube */       "-",     "-",       "%4,S,>S,,",      "FUI,U,F,,",      EShLangAll,   true },

        // UINT Width, UINT Height, UINT Elements
        // UINT MipLevel, UINT Width, UINT Height, UINT Elements, UINT NumberOfLevels
        { "GetDimensions",   /* CubeArray */  "-",     "-",       "@4,>S,,",        "FUI,U,,",        EShLangAll,   true },
        { "GetDimensions",   /* CubeArray */  "-",     "-",       "@4,>S,,",        "FUI,F,,",        EShLangAll,   true },
        { "GetDimensions",   /* CubeArray */  "-",     "-",       "@4,S,>S,,,",     "FUI,U,,,,",      EShLangAll,   true },
        { "GetDimensions",   /* CubeArray */  "-",     "-",       "@4,S,>S,,,",     "FUI,U,F,,,",     EShLangAll,   true },

        // UINT Width, UINT Height, UINT Samples
        // UINT Width, UINT Height, UINT Elements, UINT Samples
        { "GetDimensions",   /* 2DMS */       "-",     "-",       "$2,>S,,",        "FUI,U,,",        EShLangAll,   true },
        { "GetDimensions",   /* 2DMS */       "-",     "-",       "$2,>S,,",        "FUI,U,,",        EShLangAll,   true },
        { "GetDimensions",   /* 2DMSArray */  "-",     "-",       "&2,>S,,,",       "FUI,U,,,",       EShLangAll,   true },
        { "GetDimensions",   /* 2DMSArray */  "-",     "-",       "&2,>S,,,",       "FUI,U,,,",       EShLangAll,   true },

        // SM5 texture methods
        { "GatherRed",       /*!O*/           "V4",    nullptr,   "%@,S,V",         "FIU,S,F",        EShLangAll,   true },
        { "GatherRed",       /* O*/           "V4",    nullptr,   "%@,S,V,",        "FIU,S,F,I",      EShLangAll,   true },
        { "GatherRed",       /* O, status*/   "V4",    nullptr,   "%@,S,V,,>S",     "FIU,S,F,I,U",    EShLangAll,   true },
        { "GatherRed",       /* O-4 */        "V4",    nullptr,   "%@,S,V,,,,",     "FIU,S,F,I,,,",   EShLangAll,   true },
        { "GatherRed",       /* O-4, status */"V4",    nullptr,   "%@,S,V,,,,,S",   "FIU,S,F,I,,,,U", EShLangAll,   true },

        { "GatherGreen",     /*!O*/           "V4",    nullptr,   "%@,S,V",         "FIU,S,F",        EShLangAll,   true },
        { "GatherGreen",     /* O*/           "V4",    nullptr,   "%@,S,V,",        "FIU,S,F,I",      EShLangAll,   true },
        { "GatherGreen",     /* O, status*/   "V4",    nullptr,   "%@,S,V,,>S",     "FIU,S,F,I,U",    EShLangAll,   true },
        { "GatherGreen",     /* O-4 */        "V4",    nullptr,   "%@,S,V,,,,",     "FIU,S,F,I,,,",   EShLangAll,   true },
        { "GatherGreen",     /* O-4, status */"V4",    nullptr,   "%@,S,V,,,,,S",   "FIU,S,F,I,,,,U", EShLangAll,   true },

        { "GatherBlue",      /*!O*/           "V4",    nullptr,   "%@,S,V",         "FIU,S,F",        EShLangAll,   true },
        { "GatherBlue",      /* O*/           "V4",    nullptr,   "%@,S,V,",        "FIU,S,F,I",      EShLangAll,   true },
        { "GatherBlue",      /* O, status*/   "V4",    nullptr,   "%@,S,V,,>S",     "FIU,S,F,I,U",    EShLangAll,   true },
        { "GatherBlue",      /* O-4 */        "V4",    nullptr,   "%@,S,V,,,,",     "FIU,S,F,I,,,",   EShLangAll,   true },
        { "GatherBlue",      /* O-4, status */"V4",    nullptr,   "%@,S,V,,,,,S",   "FIU,S,F,I,,,,U", EShLangAll,   true },

        { "GatherAlpha",     /*!O*/           "V4",    nullptr,   "%@,S,V",         "FIU,S,F",        EShLangAll,   true },
        { "GatherAlpha",     /* O*/           "V4",    nullptr,   "%@,S,V,",        "FIU,S,F,I",      EShLangAll,   true },
        { "GatherAlpha",     /* O, status*/   "V4",    nullptr,   "%@,S,V,,>S",     "FIU,S,F,I,U",    EShLangAll,   true },
        { "GatherAlpha",     /* O-4 */        "V4",    nullptr,   "%@,S,V,,,,",     "FIU,S,F,I,,,",   EShLangAll,   true },
        { "GatherAlpha",     /* O-4, status */"V4",    nullptr,   "%@,S,V,,,,,S",   "FIU,S,F,I,,,,U", EShLangAll,   true },

        { "GatherCmp",       /*!O*/           "V4",    nullptr,   "%@,S,V,S",       "FIU,s,F,",       EShLangAll,   true },
        { "GatherCmp",       /* O*/           "V4",    nullptr,   "%@,S,V,S,V",     "FIU,s,F,,I",     EShLangAll,   true },
        { "GatherCmp",       /* O, status*/   "V4",    nullptr,   "%@,S,V,S,V,>S",  "FIU,s,F,,I,U",   EShLangAll,   true },
        { "GatherCmp",       /* O-4 */        "V4",    nullptr,   "%@,S,V,S,V,,,",  "FIU,s,F,,I,,,",  EShLangAll,   true },
        { "GatherCmp",       /* O-4, status */"V4",    nullptr,   "%@,S,V,S,V,,V,S","FIU,s,F,,I,,,,U",EShLangAll,   true },

        { "GatherCmpRed",    /*!O*/           "V4",    nullptr,   "%@,S,V,S",       "FIU,s,F,",       EShLangAll,   true },
        { "GatherCmpRed",    /* O*/           "V4",    nullptr,   "%@,S,V,S,V",     "FIU,s,F,,I",     EShLangAll,   true },
        { "GatherCmpRed",    /* O, status*/   "V4",    nullptr,   "%@,S,V,S,V,>S",  "FIU,s,F,,I,U",   EShLangAll,   true },
        { "GatherCmpRed",    /* O-4 */        "V4",    nullptr,   "%@,S,V,S,V,,,",  "FIU,s,F,,I,,,",  EShLangAll,   true },
        { "GatherCmpRed",    /* O-4, status */"V4",    nullptr,   "%@,S,V,S,V,,V,S","FIU,s,F,,I,,,,U",EShLangAll,   true },

        { "GatherCmpGreen",  /*!O*/           "V4",    nullptr,   "%@,S,V,S",       "FIU,s,F,",       EShLangAll,   true },
        { "GatherCmpGreen",  /* O*/           "V4",    nullptr,   "%@,S,V,S,V",     "FIU,s,F,,I",     EShLangAll,   true },
        { "GatherCmpGreen",  /* O, status*/   "V4",    nullptr,   "%@,S,V,S,V,>S",  "FIU,s,F,,I,U",   EShLangAll,   true },
        { "GatherCmpGreen",  /* O-4 */        "V4",    nullptr,   "%@,S,V,S,V,,,",  "FIU,s,F,,I,,,",  EShLangAll,   true },
        { "GatherCmpGreen",  /* O-4, status */"V4",    nullptr,   "%@,S,V,S,V,,,,S","FIU,s,F,,I,,,,U",EShLangAll,   true },

        { "GatherCmpBlue",   /*!O*/           "V4",    nullptr,   "%@,S,V,S",       "FIU,s,F,",       EShLangAll,   true },
        { "GatherCmpBlue",   /* O*/           "V4",    nullptr,   "%@,S,V,S,V",     "FIU,s,F,,I",     EShLangAll,   true },
        { "GatherCmpBlue",   /* O, status*/   "V4",    nullptr,   "%@,S,V,S,V,>S",  "FIU,s,F,,I,U",   EShLangAll,   true },
        { "GatherCmpBlue",   /* O-4 */        "V4",    nullptr,   "%@,S,V,S,V,,,",  "FIU,s,F,,I,,,",  EShLangAll,   true },
        { "GatherCmpBlue",   /* O-4, status */"V4",    nullptr,   "%@,S,V,S,V,,,,S","FIU,s,F,,I,,,,U",EShLangAll,   true },

        { "GatherCmpAlpha",  /*!O*/           "V4",    nullptr,   "%@,S,V,S",       "FIU,s,F,",       EShLangAll,   true },
        { "GatherCmpAlpha",  /* O*/           "V4",    nullptr,   "%@,S,V,S,V",     "FIU,s,F,,I",     EShLangAll,   true },
        { "GatherCmpAlpha",  /* O, status*/   "V4",    nullptr,   "%@,S,V,S,V,>S",  "FIU,s,F,,I,U",   EShLangAll,   true },
        { "GatherCmpAlpha",  /* O-4 */        "V4",    nullptr,   "%@,S,V,S,V,,,",  "FIU,s,F,,I,,,",  EShLangAll,   true },
        { "GatherCmpAlpha",  /* O-4, status */"V4",    nullptr,   "%@,S,V,S,V,,,,S","FIU,s,F,,I,,,,U",EShLangAll,   true },

        // geometry methods
        { "Append",                           "-",     "-",       "-",              "-",              EShLangGS ,   true },
        { "RestartStrip",                     "-",     "-",       "-",              "-",              EShLangGS ,   true },

        // Methods for structurebuffers.  TODO: wildcard type matching.
        { "Load",                             nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Load2",                            nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Load3",                            nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Load4",                            nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Store",                            nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Store2",                           nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Store3",                           nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Store4",                           nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "GetDimensions",                    nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedAdd",                   nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedAnd",                   nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedCompareExchange",       nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedCompareStore",          nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedExchange",              nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedMax",                   nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedMin",                   nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedOr",                    nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "InterlockedXor",                   nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "IncrementCounter",                 nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "DecrementCounter",                 nullptr, nullptr,   "-",              "-",              EShLangAll,   true },
        { "Consume",                          nullptr, nullptr,   "-",              "-",              EShLangAll,   true },

        // SM 6.0

        { "WaveIsFirstLane",                  "S",     "B",       "-",              "-",              EShLangPSCS,  false},
        { "WaveGetLaneCount",                 "S",     "U",       "-",              "-",              EShLangPSCS,  false},
        { "WaveGetLaneIndex",                 "S",     "U",       "-",              "-",              EShLangPSCS,  false},
        { "WaveActiveAnyTrue",                "S",     "B",       "S",              "B",              EShLangPSCS,  false},
        { "WaveActiveAllTrue",                "S",     "B",       "S",              "B",              EShLangPSCS,  false},
        { "WaveActiveBallot",                 "V4",    "U",       "S",              "B",              EShLangPSCS,  false},
        { "WaveReadLaneAt",                   nullptr, nullptr,   "SV,S",           "DFUI,U",         EShLangPSCS,  false},
        { "WaveReadLaneFirst",                nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveAllEqual",               "S",     "B",       "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveAllEqualBool",           "S",     "B",       "S",              "B",              EShLangPSCS,  false},
        { "WaveActiveCountBits",              "S",     "U",       "S",              "B",              EShLangPSCS,  false},

        { "WaveActiveSum",                    nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveProduct",                nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveBitAnd",                 nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveBitOr",                  nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveBitXor",                 nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveMin",                    nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WaveActiveMax",                    nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WavePrefixSum",                    nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WavePrefixProduct",                nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "WavePrefixCountBits",              "S",     "U",       "S",              "B",              EShLangPSCS,  false},
        { "QuadReadAcrossX",                  nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "QuadReadAcrossY",                  nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "QuadReadAcrossDiagonal",           nullptr, nullptr,   "SV",             "DFUI",           EShLangPSCS,  false},
        { "QuadReadLaneAt",                   nullptr, nullptr,   "SV,S",           "DFUI,U",         EShLangPSCS,  false},

        // Methods for subpass input objects
        { "SubpassLoad",                      "V4",    nullptr,   "[",              "FIU",            EShLangPS,    true },
        { "SubpassLoad",                      "V4",    nullptr,   "],S",            "FIU,I",          EShLangPS,    true },

        // Mark end of list, since we want to avoid a range-based for, as some compilers don't handle it yet.
        { nullptr,                            nullptr, nullptr,   nullptr,      nullptr,  0, false },
    };

    // Create prototypes for the intrinsics.  TODO: Avoid ranged based for until all compilers can handle it.
    for (int icount = 0; hlslIntrinsics[icount].name; ++icount) {
        const auto& intrinsic = hlslIntrinsics[icount];

        for (int stage = 0; stage < EShLangCount; ++stage) {                                // for each stage...
            if ((intrinsic.stage & (1<<stage)) == 0) // skip inapplicable stages
                continue;

            // reference to either the common builtins, or stage specific builtins.
            TString& s = (intrinsic.stage == EShLangAll) ? commonBuiltins : stageBuiltins[stage];

            for (const char* argOrder = intrinsic.argOrder; !IsEndOfArg(argOrder); ++argOrder) { // for each order...
                const bool isTexture   = IsTextureType(*argOrder);
                const bool isArrayed   = IsArrayed(*argOrder);
                const bool isMS        = IsTextureMS(*argOrder);
                const bool isBuffer    = IsBuffer(*argOrder);
                const bool isImage     = IsImage(*argOrder);
                const bool mipInCoord  = HasMipInCoord(intrinsic.name, isMS, isBuffer, isImage);
                const int fixedVecSize = FixedVecSize(argOrder);
                const int coordArg     = CoordinateArgPos(intrinsic.name, isTexture);

                // calculate min and max vector and matrix dimensions
                int dim0Min = 1;
                int dim0Max = 1;
                int dim1Min = 1;
                int dim1Max = 1;

                FindVectorMatrixBounds(argOrder, fixedVecSize, dim0Min, dim0Max, dim1Min, dim1Max);

                for (const char* argType = intrinsic.argType; !IsEndOfArg(argType); ++argType) { // for each type...
                    for (int dim0 = dim0Min; dim0 <= dim0Max; ++dim0) {          // for each dim 0...
                        for (int dim1 = dim1Min; dim1 <= dim1Max; ++dim1) {      // for each dim 1...
                            const char* retOrder = intrinsic.retOrder ? intrinsic.retOrder : argOrder;
                            const char* retType  = intrinsic.retType  ? intrinsic.retType  : argType;

                            if (!IsValid(intrinsic.name, *retOrder, *retType, *argOrder, *argType, dim0, dim1))
                                continue;

                            // Reject some forms of sample methods that don't exist.
                            if (isTexture && IsIllegalSample(intrinsic.name, argOrder, dim0))
                                continue;

                            AppendTypeName(s, retOrder, retType, dim0, dim1);  // add return type
                            s.append(" ");                                     // space between type and name

                            // methods have a prefix.  TODO: it would be better as an invalid identifier character,
                            // but that requires a scanner change.
                            if (intrinsic.method)
                                s.append(BUILTIN_PREFIX);

                            s.append(intrinsic.name);                          // intrinsic name
                            s.append("(");                                     // open paren

                            const char* prevArgOrder = nullptr;
                            const char* prevArgType = nullptr;

                            // Append argument types, if any.
                            for (int arg = 0; ; ++arg) {
                                const char* nthArgOrder(NthArg(argOrder, arg));
                                const char* nthArgType(NthArg(argType, arg));

                                if (nthArgOrder == nullptr || nthArgType == nullptr)
                                    break;

                                // cube textures use vec3 coordinates
                                int argDim0 = isTexture && arg > 0 ? std::min(dim0, 3) : dim0;

                                s.append(arg > 0 ? ", ": "");  // comma separator if needed

                                const char* orderBegin = nthArgOrder;
                                nthArgOrder = IoParam(s, nthArgOrder);

                                // Comma means use the previous argument order and type.
                                HandleRepeatArg(nthArgOrder, prevArgOrder, orderBegin);
                                HandleRepeatArg(nthArgType,  prevArgType, nthArgType);

                                // In case the repeated arg has its own I/O marker
                                nthArgOrder = IoParam(s, nthArgOrder);

                                // arrayed textures have one extra coordinate dimension, except for
                                // the CalculateLevelOfDetail family.
                                if (isArrayed && arg == coordArg && !NoArrayCoord(intrinsic.name))
                                    argDim0++;

                                // Some texture methods use an addition arg dimension to hold mip
                                if (arg == coordArg && mipInCoord)
                                    argDim0++;

                                // For textures, the 1D case isn't a 1-vector, but a scalar.
                                if (isTexture && argDim0 == 1 && arg > 0 && *nthArgOrder == 'V')
                                    nthArgOrder = "S";

                                AppendTypeName(s, nthArgOrder, nthArgType, argDim0, dim1); // Add arguments
                            }

                            s.append(");\n");            // close paren and trailing semicolon
                        } // dim 1 loop
                    } // dim 0 loop
                } // arg type loop

                // skip over special characters
                if (isTexture && isalpha(argOrder[1]))
                    ++argOrder;
                if (isdigit(argOrder[1]))
                    ++argOrder;
            } // arg order loop

            if (intrinsic.stage == EShLangAll) // common builtins are only added once.
                break;
        }
    }

    createMatTimesMat(); // handle this case separately, for convenience

    // printf("Common:\n%s\n",   getCommonString().c_str());
    // printf("Frag:\n%s\n",     getStageString(EShLangFragment).c_str());
    // printf("Vertex:\n%s\n",   getStageString(EShLangVertex).c_str());
    // printf("Geo:\n%s\n",      getStageString(EShLangGeometry).c_str());
    // printf("TessCtrl:\n%s\n", getStageString(EShLangTessControl).c_str());
    // printf("TessEval:\n%s\n", getStageString(EShLangTessEvaluation).c_str());
    // printf("Compute:\n%s\n",  getStageString(EShLangCompute).c_str());
}